

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programs.hpp
# Opt level: O1

void __thiscall qe::ShaderAssignments::assign(ShaderAssignments *this,string *name,string *value)

{
  pointer pcVar1;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_60._0_8_ = local_60 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (value->_M_dataplus)._M_p;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + value->_M_string_length);
  std::vector<qe::ShaderAssignments::assigns_t,_std::allocator<qe::ShaderAssignments::assigns_t>_>::
  emplace_back<qe::ShaderAssignments::assigns_t>(&this->_assigns,(assigns_t *)local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  return;
}

Assistant:

void assign(std::string name, std::string value) {
            _assigns.push_back(assigns_t {name, value});
        }